

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  char *__dest;
  tm *__tp;
  size_t sVar1;
  int iVar2;
  char **ppcVar3;
  undefined1 local_68 [8];
  timeval tv;
  char str_t [26];
  __time_t local_30;
  time_t time;
  char ms [4];
  
  tv.tv_usec = 0;
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  local_30 = (__time_t)local_68;
  __tp = localtime(&local_30);
  strftime((char *)&tv.tv_usec,0x1a,"%Y-%m-%d %H:%M:%S",__tp);
  snprintf((char *)((long)&time + 4),4,"%03d",
           (ulong)(uint)((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tv.tv_sec),8) >> 7) -
                        (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tv.tv_sec),0xc) >> 0x1f)));
  sVar1 = strlen((char *)&tv.tv_usec);
  __dest = (this->stream_).buffer_.cur_;
  ppcVar3 = &(this->stream_).buffer_.cur_;
  iVar2 = (int)ppcVar3;
  if ((int)sVar1 < iVar2 - (int)__dest) {
    memcpy(__dest,&tv.tv_usec,sVar1);
    *ppcVar3 = *ppcVar3 + sVar1;
  }
  if (1 < iVar2 - (int)*ppcVar3) {
    **ppcVar3 = '.';
    *ppcVar3 = *ppcVar3 + 1;
  }
  sVar1 = strlen((char *)((long)&time + 4));
  if ((int)sVar1 < iVar2 - (int)*ppcVar3) {
    memcpy(*ppcVar3,(void *)((long)&time + 4),sVar1);
    *ppcVar3 = *ppcVar3 + sVar1;
  }
  if (4 < iVar2 - (int)*ppcVar3) {
    builtin_strncpy(*ppcVar3,"    ",4);
    *ppcVar3 = *ppcVar3 + 4;
  }
  return;
}

Assistant:

void Logger::Impl::formatTime() {
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday(&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S", p_time);
    char ms[4];
    snprintf(ms, sizeof(ms), "%03d", static_cast<int>(tv.tv_usec/1000));
    stream_ << str_t << "." << ms << "    ";
}